

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectPrototypeObject.cpp
# Opt level: O1

void __thiscall
Js::ObjectPrototypeObject::PostDefineOwnProperty__proto__
          (ObjectPrototypeObject *this,RecyclableObject *obj)

{
  ScriptContext *pSVar1;
  JavascriptLibrary *pJVar2;
  int iVar3;
  bool bVar4;
  JavascriptFunction *local_28;
  Var getter;
  Var setter;
  
  if ((ObjectPrototypeObject *)obj != this) {
    return;
  }
  pSVar1 = (((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)
           ->super_JavascriptLibraryBase).scriptContext.ptr;
  iVar3 = (*(this->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
            super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x15])
                    (this,0x1eb,&local_28,&getter,pSVar1);
  if ((iVar3 == 0) ||
     (pJVar2 = (pSVar1->super_ScriptContextBase).javascriptLibrary,
     local_28 != (pJVar2->super_JavascriptLibraryBase).__proto__getterFunction.ptr)) {
    bVar4 = false;
  }
  else {
    bVar4 = (JavascriptFunction *)getter ==
            (pJVar2->super_JavascriptLibraryBase).__proto__setterFunction.ptr;
  }
  this->__proto__Enabled = bVar4;
  return;
}

Assistant:

void ObjectPrototypeObject::PostDefineOwnProperty__proto__(RecyclableObject* obj)
    {
        if (obj == this)
        {
            ScriptContext* scriptContext = this->GetScriptContext();
            Var getter, setter;

            // __proto__Enabled is now only used by diagnostics to decide displaying __proto__ or [prototype].
            // We consider __proto__ is enabled when original getter and setter are both in place.
            this->__proto__Enabled =
                this->GetAccessors(PropertyIds::__proto__, &getter, &setter, scriptContext)
                && getter == scriptContext->GetLibrary()->Get__proto__getterFunction()
                && setter == scriptContext->GetLibrary()->Get__proto__setterFunction();
        }
    }